

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(TcpSocket_*,_void_*)> * __thiscall
TcpSocket::BindFuncConEstablished
          (function<void_(TcpSocket_*,_void_*)> *__return_storage_ptr__,TcpSocket *this,
          function<void_(TcpSocket_*,_void_*)> *fClientConnected)

{
  BaseSocketImpl *pBVar1;
  long *local_68;
  function<void_(TcpSocket_*,_void_*)> local_40;
  function<void_(TcpSocket_*,_void_*)> *local_20;
  function<void_(TcpSocket_*,_void_*)> *fClientConnected_local;
  TcpSocket *this_local;
  
  local_20 = fClientConnected;
  fClientConnected_local = (function<void_(TcpSocket_*,_void_*)> *)this;
  this_local = (TcpSocket *)__return_storage_ptr__;
  pBVar1 = BaseSocket::GetImpl(&this->super_BaseSocket);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_68 = (long *)0x0;
  }
  else {
    local_68 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::function<void_(TcpSocket_*,_void_*)>::function(&local_40,fClientConnected);
  (**(code **)(*local_68 + 0xe0))(__return_storage_ptr__,local_68,&local_40);
  std::function<void_(TcpSocket_*,_void_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(TcpSocket*, void*)> TcpSocket::BindFuncConEstablished(std::function<void(TcpSocket*, void*)> fClientConnected)
{
    return dynamic_cast<TcpSocketImpl*>(GetImpl())->BindFuncConEstablished(fClientConnected);
}